

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcInstPrinter.c
# Opt level: O0

void set_mem_access(MCInst *MI,_Bool status,int reg)

{
  cs_detail *pcVar1;
  uint8_t *puVar2;
  int reg_local;
  _Bool status_local;
  MCInst *MI_local;
  
  if (MI->csh->detail == CS_OPT_ON) {
    MI->csh->doing_mem = status;
    if (status) {
      if ((reg == 0xffff) || (reg == -0xffff)) {
        pcVar1 = MI->flat_insn->detail;
        (pcVar1->field_6).x86.prefix[0] = (pcVar1->field_6).x86.prefix[0] + 0xff;
        puVar2 = MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x11;
        puVar2[0] = '\x03';
        puVar2[1] = '\0';
        puVar2[2] = '\0';
        puVar2[3] = '\0';
        MI->flat_insn->detail->groups
        [(ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x15] =
             (uint8_t)*(undefined4 *)
                       (MI->flat_insn->detail->groups +
                       (ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x15);
        MI->flat_insn->detail->groups
        [(ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x16] = '\0';
        puVar2 = MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x19;
        puVar2[0] = '\0';
        puVar2[1] = '\0';
        puVar2[2] = '\0';
        puVar2[3] = '\0';
        if (reg < 1) {
          puVar2 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x1d;
          puVar2[0] = 0xff;
          puVar2[1] = 0xff;
          puVar2[2] = 0xff;
          puVar2[3] = 0xff;
        }
        else {
          puVar2 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x1d;
          puVar2[0] = '\x01';
          puVar2[1] = '\0';
          puVar2[2] = '\0';
          puVar2[3] = '\0';
        }
      }
      else {
        puVar2 = MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x11;
        puVar2[0] = '\x03';
        puVar2[1] = '\0';
        puVar2[2] = '\0';
        puVar2[3] = '\0';
        if (reg == 0) {
          MI->flat_insn->detail->groups
          [(ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x15] = '\0';
        }
        else {
          MI->flat_insn->detail->groups
          [(ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x15] = (uint8_t)reg;
        }
        MI->flat_insn->detail->groups
        [(ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x16] = '\0';
        puVar2 = MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x19;
        puVar2[0] = '\0';
        puVar2[1] = '\0';
        puVar2[2] = '\0';
        puVar2[3] = '\0';
        puVar2 = MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x1d;
        puVar2[0] = '\x01';
        puVar2[1] = '\0';
        puVar2[2] = '\0';
        puVar2[3] = '\0';
      }
    }
    else if (reg != 0) {
      MI->flat_insn->detail->groups
      [(ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x16] = (uint8_t)reg;
      pcVar1 = MI->flat_insn->detail;
      (pcVar1->field_6).x86.prefix[0] = (pcVar1->field_6).x86.prefix[0] + '\x01';
    }
  }
  return;
}

Assistant:

static void set_mem_access(MCInst *MI, bool status)
{
	if (MI->csh->detail != CS_OPT_ON)
		return;

	MI->csh->doing_mem = status;

	if (status) {
		MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].type = SPARC_OP_MEM;
		MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].mem.base = SPARC_REG_INVALID;
		MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].mem.disp = 0;
	} else {
		// done, create the next operand slot
		MI->flat_insn->detail->sparc.op_count++;
	}
}